

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O3

int h262_motion_vectors(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,
                       h262_macroblock *mb,int s)

{
  uint32_t *val;
  uint32_t *val_00;
  uint32_t uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  long lVar11;
  ulong local_90;
  
  if (picparm->picture_structure == 3) {
    uVar1 = mb->frame_motion_type;
    if (uVar1 == 1) {
LAB_0010344f:
      local_90 = 2;
LAB_00103454:
      bVar4 = true;
      bVar3 = false;
      goto LAB_00103461;
    }
    if (uVar1 != 3) {
      if (uVar1 != 2) {
LAB_0010342a:
        abort();
      }
      bVar3 = true;
      local_90 = 1;
      bVar4 = true;
      goto LAB_00103461;
    }
  }
  else {
    uVar2 = mb->field_motion_type;
    local_90 = (ulong)uVar2;
    if (local_90 == 1) goto LAB_00103454;
    if (uVar2 != 3) {
      if (uVar2 != 2) goto LAB_0010342a;
      goto LAB_0010344f;
    }
  }
  bVar3 = true;
  local_90 = 1;
  bVar4 = false;
LAB_00103461:
  lVar8 = (long)s;
  uVar9 = 0;
  bVar5 = true;
  while( true ) {
    while (uVar9 < local_90) {
      if ((!bVar3) &&
         (iVar7 = vs_u(str,mb->motion_vertical_field_select[uVar9] + lVar8,1), iVar7 != 0)) {
        return 1;
      }
      lVar11 = 0;
      bVar6 = true;
      do {
        bVar10 = bVar6;
        val = mb->motion_code[uVar9][lVar8] + lVar11;
        iVar7 = vs_vlc(str,val,motion_code_vlc);
        if (iVar7 != 0) {
          return 1;
        }
        val_00 = mb->motion_residual[uVar9][lVar8] + lVar11;
        if (*val == 0) {
          iVar7 = vs_infer(str,val_00,0);
        }
        else {
          iVar7 = vs_u(str,val_00,picparm->f_code[lVar8][lVar11] - 1);
        }
        if (iVar7 != 0) {
          return 1;
        }
        if ((!bVar4) && (iVar7 = vs_vlc(str,mb->dmvector + lVar11,dmvector_vlc), iVar7 != 0)) {
          return 1;
        }
        lVar11 = 1;
        bVar6 = false;
      } while (bVar10);
      uVar9 = 1;
      bVar6 = !bVar5;
      bVar5 = false;
      if (bVar6) {
        return 0;
      }
    }
    iVar7 = vs_infer(str,mb->motion_code[1][lVar8],0);
    if (iVar7 != 0) {
      return 1;
    }
    iVar7 = vs_infer(str,mb->motion_residual[-1][lVar8] + 1,0);
    if (iVar7 != 0) break;
    iVar7 = vs_infer(str,mb->motion_residual[1][lVar8],0);
    if (iVar7 != 0) {
      return 1;
    }
    iVar7 = vs_infer(str,mb->dmvector + lVar8 * 2 + -3,0);
    uVar9 = 1;
    bVar6 = (bool)(bVar5 & iVar7 == 0);
    bVar5 = false;
    if (!bVar6) {
      return (uint)(iVar7 != 0);
    }
  }
  return 1;
}

Assistant:

int h262_motion_vectors(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, int s) {
	int mvc, mfs, dmv;
	if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
		switch (mb->frame_motion_type) {
			case H262_FRAME_MOTION_FIELD:
				mvc = 2;
				mfs = 1;
				dmv = 0;
				break;
			case H262_FRAME_MOTION_FRAME:
				mvc = 1;
				mfs = 0;
				dmv = 0;
				break;
			case H262_FRAME_MOTION_DUAL_PRIME:
				mvc = 1;
				mfs = 0;
				dmv = 1;
				break;
			default:
				abort();
		}
	} else {
		switch (mb->field_motion_type) {
			case H262_FIELD_MOTION_FIELD:
				mvc = 1;
				mfs = 1;
				dmv = 0;
				break;
			case H262_FIELD_MOTION_16X8:
				mvc = 2;
				mfs = 1;
				dmv = 0;
				break;
			case H262_FIELD_MOTION_DUAL_PRIME:
				mvc = 1;
				mfs = 0;
				dmv = 1;
				break;
			default:
				abort();
		}
	}
	int r, t;
	for (r = 0; r < 2; r++) {
		if (r < mvc) {
			if (mfs)
				if (vs_u(str, &mb->motion_vertical_field_select[r][s], 1)) return 1;
			for (t = 0; t < 2; t++) {
				if (vs_vlc(str, &mb->motion_code[r][s][t], motion_code_vlc)) return 1;
				if (mb->motion_code[r][s][t]) {
					if (vs_u(str, &mb->motion_residual[r][s][t], picparm->f_code[s][t]-1)) return 1;
				} else {
					if (vs_infer(str, &mb->motion_residual[r][s][t], 0)) return 1;
				}
				if (dmv) {
					if (vs_vlc(str, &mb->dmvector[t], dmvector_vlc)) return 1;
				}
			}
		} else {
			if (vs_infer(str, &mb->motion_code[r][s][0], 0)) return 1;
			if (vs_infer(str, &mb->motion_code[r][s][1], 0)) return 1;
			if (vs_infer(str, &mb->motion_residual[r][s][0], 0)) return 1;
			if (vs_infer(str, &mb->motion_residual[r][s][1], 0)) return 1;
		}
	}
	return 0;
}